

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O0

shared_ptr<BER_CONTAINER> __thiscall
StaticIntegerCallback::buildTypeWithValue(StaticIntegerCallback *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<BER_CONTAINER> sVar1;
  shared_ptr<IntegerType> local_28;
  StaticIntegerCallback *this_local;
  
  this_local = this;
  std::make_shared<IntegerType,int_const&>((int *)&local_28);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
            ((shared_ptr<BER_CONTAINER> *)this,&local_28);
  Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> buildTypeWithValue() override {
        return std::make_shared<IntegerType>(val);
    }